

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall
diff_match_patch_test::assertFalse(diff_match_patch_test *this,wstring *strCase,bool value)

{
  undefined8 uVar1;
  wstring *this_00;
  bool value_local;
  wstring *strCase_local;
  diff_match_patch_test *this_local;
  
  if (value) {
    ResetOutputStream();
    uVar1 = std::__cxx11::wstring::c_str();
    wprintf(L"%ls FAIL\nExpected: false\nActual: true",uVar1);
    wprintf(L"\n");
    this_00 = (wstring *)__cxa_allocate_exception(0x20);
    std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
    __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
  }
  ResetOutputStream();
  uVar1 = std::__cxx11::wstring::c_str();
  wprintf(L"%ls OK",uVar1);
  wprintf(L"\n");
  return;
}

Assistant:

void diff_match_patch_test::assertFalse(const std::wstring &strCase, bool value) {
  if (value) {
    dmpDebug(L"%ls FAIL\nExpected: false\nActual: true", dmpPrintable(strCase));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}